

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_IAB.cpp
# Opt level: O0

bool anon_unknown.dwarf_eca6e::checkFrameCapacity
               (FrameBuffer *frame,size_t size,bool reallocate_if_needed)

{
  ui32_t uVar1;
  Result_t local_90 [8];
  Result_t result;
  bool reallocate_if_needed_local;
  size_t size_local;
  FrameBuffer *frame_local;
  
  uVar1 = ASDCP::FrameBuffer::Capacity(frame);
  if (uVar1 < size) {
    if (reallocate_if_needed) {
      ASDCP::FrameBuffer::Capacity((uint)local_90);
      frame_local._7_1_ = Kumu::Result_t::operator==(local_90,(Result_t *)Kumu::RESULT_OK);
      Kumu::Result_t::~Result_t(local_90);
    }
    else {
      frame_local._7_1_ = false;
    }
  }
  else {
    frame_local._7_1_ = true;
  }
  return frame_local._7_1_;
}

Assistant:

bool checkFrameCapacity(ASDCP::FrameBuffer& frame, size_t size, bool reallocate_if_needed) {

    if (frame.Capacity() < size) {
      if (!reallocate_if_needed) {
        return false;
      }
      Result_t result = frame.Capacity(size);
      return result == RESULT_OK;
    }
    return true;
  }